

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.h
# Opt level: O0

string * pbrt::ToString_abi_cxx11_(SpectrumType t)

{
  int in_ESI;
  string *in_RDI;
  char *in_stack_00000058;
  int in_stack_00000064;
  char *in_stack_00000068;
  LogLevel in_stack_00000074;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  }
  else {
    if (in_ESI != 2) {
      LogFatal(in_stack_00000074,in_stack_00000068,in_stack_00000064,in_stack_00000058);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
  }
  return in_RDI;
}

Assistant:

inline std::string ToString(SpectrumType t) {
    switch (t) {
    case SpectrumType::Albedo:
        return "Albedo";
    case SpectrumType::Unbounded:
        return "Unbounded";
    case SpectrumType::Illuminant:
        return "Illuminant";
    default:
        LOG_FATAL("Unhandled SpectrumType");
    }
}